

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbiw__outfile(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,
                  void *data,int alpha,int pad,char *fmt,...)

{
  char in_AL;
  int iVar1;
  ulong uVar2;
  int iVar3;
  undefined4 uVar4;
  void *pvVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined4 local_124;
  long local_120;
  ulong local_118;
  void *local_110;
  va_list v;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  uVar4 = (undefined4)((ulong)_comp >> 0x20);
  iVar1 = (int)_comp;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    iVar1 = 0;
  }
  else {
    v[0].reg_save_area = local_e8;
    v[0].overflow_arg_area = &stack0x00000030;
    v[0].gp_offset = 0x30;
    v[0].fp_offset = 0x30;
    iVar3 = iVar1;
    stbiw__writefv(s,"11 4 22 44 44 22 444444",v);
    local_124 = 0;
    if (0 < y) {
      local_118 = 0;
      if (0 < x) {
        local_118 = (ulong)(uint)x;
      }
      uVar6 = (ulong)(uint)y;
      local_120 = (long)x * (long)iVar1;
      pvVar5 = (void *)((uVar6 - 1) * local_120 + (long)data);
      local_120 = -local_120;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, uVar2 = local_118, local_110 = pvVar5, bVar7) {
        while (uVar2 != 0) {
          stbiw__write_pixel(s,iVar1,0,1,(int)pvVar5,(uchar *)CONCAT44(uVar4,iVar3));
          pvVar5 = (void *)((long)pvVar5 + (long)iVar1);
          uVar2 = uVar2 - 1;
        }
        stbiw__write_flush(s);
        (*s->func)(s->context,&local_124,pad);
        pvVar5 = (void *)((long)local_110 + local_120);
      }
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbiw__outfile(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   if (y < 0 || x < 0) {
      return 0;
   } else {
      va_list v;
      va_start(v, fmt);
      stbiw__writefv(s, fmt, v);
      va_end(v);
      stbiw__write_pixels(s,rgb_dir,vdir,x,y,comp,data,alpha,pad, expand_mono);
      return 1;
   }
}